

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::iterate(CommonEdgeCase *this)

{
  CaseType CVar1;
  RenderContext *pRVar2;
  short sVar3;
  deUint16 adVar4 [4];
  deUint16 adVar5 [4];
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  ulong uVar9;
  Surface *surface;
  char *pcVar10;
  size_type sVar11;
  void *__buf;
  int n;
  int iVar12;
  long lVar13;
  int m;
  uint uVar14;
  char *pcVar15;
  int j;
  int iVar16;
  size_type __n;
  ulong uVar17;
  int i;
  int iVar18;
  bool bVar19;
  allocator<char> local_452;
  allocator<char> local_451;
  ulong local_450;
  deUint32 local_444;
  int local_440;
  uint local_43c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> gridIndices;
  Surface rendered;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> gridTessParams;
  string local_3c8;
  deUint16 local_3a8 [4];
  RenderContext *local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  vector<float,_std::allocator<float>_> gridPosComps;
  string local_358;
  deUint16 corners [4];
  ostringstream local_330 [72];
  VertexArrayBinding local_2e8 [3];
  undefined1 local_1b0 [8];
  IndexType local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  local_3a8 = (deUint16  [4])((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x100,0x100,dVar7);
  local_444 = (((this->m_program).m_ptr)->m_program).m_program;
  local_3a0 = pRVar2;
  iVar6 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar13 = CONCAT44(extraout_var_00,iVar6);
  sVar11 = 0xfffffffffffffff0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    sVar11 = 0x40;
  }
  __n = 0x60;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __n = sVar11;
  }
  gridPosComps.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  gridPosComps.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  gridPosComps.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&gridPosComps,0x32);
  std::vector<float,_std::allocator<float>_>::reserve(&gridTessParams,0x19);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve(&gridIndices,__n);
  iVar6 = 0;
  for (iVar18 = 0; iVar18 != 5; iVar18 = iVar18 + 1) {
    local_450 = CONCAT44(local_450._4_4_,((float)iVar18 + 0.5 + (float)iVar18 + 0.5) / 5.0 + -1.0);
    for (iVar16 = 0; iVar16 != 5; iVar16 = iVar16 + 1) {
      corners._0_4_ = ((float)iVar16 + 0.5 + (float)iVar16 + 0.5) / 5.0 + -1.0;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&gridPosComps,(float *)corners);
      uVar9 = local_450;
      corners[0] = (undefined2)local_450;
      corners[1] = local_450._2_2_;
      local_450 = uVar9;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&gridPosComps,(float *)corners);
      corners._0_4_ = (float)(iVar6 + iVar16) / 24.0;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&gridTessParams,(float *)corners);
    }
    iVar6 = iVar6 + 5;
  }
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    uVar8 = 2;
    iVar6 = 4;
    uVar9 = 0;
    while (iVar18 = (int)uVar9, iVar18 != 4) {
      local_388 = (ulong)(uint)(iVar18 * 5);
      local_390 = (ulong)(iVar18 * 5 + 5);
      uVar17 = 0;
      local_440 = iVar6;
      local_43c = uVar8;
      local_398 = uVar9;
      while( true ) {
        iVar18 = 3;
        if ((int)uVar17 == 4) break;
        local_450 = CONCAT44(local_450._4_4_,iVar6);
        iVar16 = (int)(uVar17 / 3) * 3;
        uVar14 = uVar8 + iVar16;
        sVar3 = (short)uVar17;
        corners[1] = sVar3 + 1 + (short)local_388;
        corners[0] = sVar3 + (short)local_388;
        corners[2] = (short)local_390 + sVar3;
        corners[3] = (short)local_390 + 1 + sVar3;
        CVar1 = this->m_caseType;
        iVar12 = ((CVar1 == CASETYPE_PRECISE) - 1) + (uint)(CVar1 == CASETYPE_PRECISE);
        local_380 = (ulong)uVar8;
        if (CVar1 == CASETYPE_BASIC) {
          iVar12 = 0;
        }
        while( true ) {
          bVar19 = iVar18 == 0;
          iVar18 = iVar18 + -1;
          if (bVar19) break;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&gridIndices,corners + (ulong)uVar14 % 3);
          uVar14 = uVar14 + 1;
        }
        iVar6 = (int)local_450;
        iVar12 = iVar12 + (int)local_450;
        for (iVar18 = 0; iVar18 != 3; iVar18 = iVar18 + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&gridIndices,corners + (long)((iVar12 + iVar16 + iVar18) % 3) + 1);
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        uVar8 = (int)local_380 - 1;
        iVar6 = iVar6 + -1;
      }
      uVar8 = local_43c + 1;
      iVar6 = local_440 + 1;
      uVar9 = (ulong)((int)local_398 + 1);
    }
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    for (uVar9 = 0; (int)uVar9 != 4; uVar9 = (ulong)((int)uVar9 + 1)) {
      local_450 = uVar9;
      for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
        for (iVar18 = 0; iVar18 != 2; iVar18 = iVar18 + 1) {
          for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
            corners[0] = ((short)iVar6 + (short)iVar16 & 1U) +
                         (((short)uVar9 + (short)iVar18 & 1U) + (short)uVar9) * 5 + (short)iVar6;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            emplace_back<unsigned_short>(&gridIndices,corners);
          }
          uVar9 = local_450;
        }
        if ((this->m_caseType == CASETYPE_PRECISE) && ((iVar6 + (int)uVar9 & 1U) == 0)) {
          std::
          __reverse<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -4);
        }
      }
    }
  }
  (**(code **)(lVar13 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar13 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar13 + 0x1680))(local_444);
  iVar6 = (uint)(this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) * 5 + -1;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    iVar6 = 3;
  }
  (**(code **)(lVar13 + 0xfd8))(0x8e72,iVar6);
  (**(code **)(lVar13 + 0x188))(0x4000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"in_v_position",(allocator<char> *)&local_358);
  glu::va::Float((VertexArrayBinding *)corners,(string *)local_1b0,2,0x19,0,
                 gridPosComps.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"in_v_tessParam",(allocator<char> *)&rendered);
  glu::va::Float(local_2e8,&local_3c8,1,0x19,0,
                 gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)local_1b0);
  pRVar2 = local_3a0;
  local_1b0._4_4_ =
       (int)((ulong)((long)gridIndices.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)gridIndices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1);
  local_1b0._0_4_ = 7;
  local_1a8 = INDEXTYPE_UINT16;
  local_1a0[0]._M_allocated_capacity =
       gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  glu::draw(local_3a0,local_444,2,(VertexArrayBinding *)corners,(PrimitiveList *)local_1b0,
            (DrawUtilCallback *)0x0);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  adVar4 = local_3a8;
  glu::checkError(dVar7,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x71c);
  lVar13 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)corners + lVar13));
    lVar13 = lVar13 + -0x50;
  } while (lVar13 != -0x48);
  getPixels(&rendered,pRVar2,&viewport);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"RenderedImage",&local_451);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"Rendered Image",&local_452);
  surface = &rendered;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_3c8,&local_358,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,adVar4._0_4_,__buf,(size_t)surface);
  adVar5 = local_3a8;
  local_3a8[0] = adVar4[0];
  local_3a8[1] = adVar4[1];
  local_3a8[2] = adVar4[2];
  local_3a8[3] = adVar4[3];
  corners[0] = local_3a8[0];
  corners[1] = local_3a8[1];
  corners[2] = local_3a8[2];
  corners[3] = local_3a8[3];
  local_3a8 = adVar5;
  std::__cxx11::ostringstream::ostringstream(local_330);
  std::operator<<((ostream *)local_330,
                  "Note: coloring is done to clarify the positioning and orientation of the ");
  pcVar10 = (char *)0x0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar10 = "quads";
  }
  pcVar15 = "triangles";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar15 = pcVar10;
  }
  std::operator<<((ostream *)local_330,pcVar15);
  std::operator<<((ostream *)local_330,
                  "; the color of a vertex corresponds to the index of that vertex in the patch");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)corners,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_330);
  tcu::LogImage::~LogImage((LogImage *)local_1b0);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_3c8);
  adVar5 = local_3a8;
  if (this->m_caseType == CASETYPE_PRECISE) {
    local_3a8[0] = adVar4[0];
    local_3a8[1] = adVar4[1];
    local_3a8[2] = adVar4[2];
    local_3a8[3] = adVar4[3];
    corners[0] = local_3a8[0];
    corners[1] = local_3a8[1];
    corners[2] = local_3a8[2];
    corners[3] = local_3a8[3];
    local_3a8 = adVar5;
    std::__cxx11::ostringstream::ostringstream(local_330);
    std::operator<<((ostream *)local_330,
                    "Note: the \'precise\' qualifier is used to avoid cracks between primitives");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)corners,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_caseType != CASETYPE_BASIC) goto LAB_0120a831;
    local_3a8[0] = adVar4[0];
    local_3a8[1] = adVar4[1];
    local_3a8[2] = adVar4[2];
    local_3a8[3] = adVar4[3];
    corners[0] = local_3a8[0];
    corners[1] = local_3a8[1];
    corners[2] = local_3a8[2];
    corners[3] = local_3a8[3];
    local_3a8 = adVar5;
    std::__cxx11::ostringstream::ostringstream(local_330);
    std::operator<<((ostream *)local_330,
                    "Note: each shared vertex has the same index among the primitives it belongs to"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)corners,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(local_330);
LAB_0120a831:
  iVar6 = (int)((float)rendered.m_height * 0.15);
  iVar18 = iVar6 * rendered.m_width;
  do {
    lVar13 = (long)(int)((float)rendered.m_width * 0.15);
    if ((int)((float)rendered.m_height * 0.85) <= iVar6) {
      local_3a8[0] = adVar4[0];
      local_3a8[1] = adVar4[1];
      local_3a8[2] = adVar4[2];
      local_3a8[3] = adVar4[3];
      corners[0] = local_3a8[0];
      corners[1] = local_3a8[1];
      corners[2] = local_3a8[2];
      corners[3] = local_3a8[3];
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,
                      "Success: there seem to be no cracks in the rendered result");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)corners,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_330);
      tcu::Surface::~Surface(&rendered);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_0120a96a:
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&gridTessParams.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&gridPosComps.super__Vector_base<float,_std::allocator<float>_>);
      return STOP;
    }
    while (lVar13 < (int)((float)rendered.m_width * 0.85)) {
      iVar16 = (int)lVar13;
      lVar13 = lVar13 + 1;
      if ((*(uint *)((long)rendered.m_pixels.m_ptr + (long)(iVar18 + iVar16) * 4) & 0xffffff) == 0)
      {
        local_3a8[0] = adVar4[0];
        local_3a8[1] = adVar4[1];
        local_3a8[2] = adVar4[2];
        local_3a8[3] = adVar4[3];
        local_1b0._0_2_ = local_3a8[0];
        local_1b0._2_2_ = local_3a8[1];
        local_1b0._4_2_ = local_3a8[2];
        local_1b0._6_2_ = local_3a8[3];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,
                        "Failure: there seem to be cracks in the rendered result");
        corners = (deUint16  [4])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream(local_330);
        std::operator<<((ostream *)local_330,"Note: pixel with zero r, g and b channels found at ");
        local_3c8._M_dataplus._M_p._0_4_ = (int)lVar13 + -1;
        local_3c8._M_dataplus._M_p._4_4_ = iVar6;
        tcu::operator<<((ostream *)local_330,(Vector<int,_2> *)&local_3c8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)corners,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_330);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image verification failed");
        tcu::Surface::~Surface(&rendered);
        goto LAB_0120a96a;
      }
    }
    iVar6 = iVar6 + 1;
    iVar18 = iVar18 + rendered.m_width;
  } while( true );
}

Assistant:

CommonEdgeCase::IterateResult CommonEdgeCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	const int					gridWidth				= 4;
	const int					gridHeight				= 4;
	const int					numVertices				= (gridWidth+1)*(gridHeight+1);
	const int					numIndices				= gridWidth*gridHeight * (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3*2 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
	const int					numPosCompsPerVertex	= 2;
	const int					totalNumPosComps		= numPosCompsPerVertex*numVertices;
	vector<float>				gridPosComps;
	vector<float>				gridTessParams;
	vector<deUint16>			gridIndices;

	gridPosComps.reserve(totalNumPosComps);
	gridTessParams.reserve(numVertices);
	gridIndices.reserve(numIndices);

	{
		for (int i = 0; i < gridHeight+1; i++)
		for (int j = 0; j < gridWidth+1; j++)
		{
			gridPosComps.push_back(-1.0f + 2.0f * ((float)j + 0.5f) / (float)(gridWidth+1));
			gridPosComps.push_back(-1.0f + 2.0f * ((float)i + 0.5f) / (float)(gridHeight+1));
			gridTessParams.push_back((float)(i*(gridWidth+1) + j) / (float)(numVertices-1));
		}
	}

	// Generate patch vertex indices.
	// \note If CASETYPE_BASIC, the vertices are ordered such that when multiple
	//		 triangles/quads share a vertex, it's at the same index for everyone.

	if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			const deUint16 corners[4] =
			{
				(deUint16)((i+0)*(gridWidth+1) + j+0),
				(deUint16)((i+0)*(gridWidth+1) + j+1),
				(deUint16)((i+1)*(gridWidth+1) + j+0),
				(deUint16)((i+1)*(gridWidth+1) + j+1)
			};

			const int secondTriangleVertexIndexOffset = m_caseType == CASETYPE_BASIC	? 0
													  : m_caseType == CASETYPE_PRECISE	? 1
													  : -1;
			DE_ASSERT(secondTriangleVertexIndexOffset != -1);

			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+0 + i + (2-j%3)) % 3]);
			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+2 + i + (2-j%3) + secondTriangleVertexIndexOffset) % 3 + 1]);
		}
	}
	else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			// \note The vertices are ordered such that when multiple quads
			//		 share a vertices, it's at the same index for everyone.
			for (int m = 0; m < 2; m++)
			for (int n = 0; n < 2; n++)
				gridIndices.push_back((deUint16)((i+(i+m)%2)*(gridWidth+1) + j+(j+n)%2));

			if(m_caseType == CASETYPE_PRECISE && (i+j) % 2 == 0)
				std::reverse(gridIndices.begin() + (gridIndices.size() - 4),
							 gridIndices.begin() + gridIndices.size());
		}
	}
	else
		DE_ASSERT(false);

	DE_ASSERT((int)gridPosComps.size() == totalNumPosComps);
	DE_ASSERT((int)gridTessParams.size() == numVertices);
	DE_ASSERT((int)gridIndices.size() == numIndices);

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		gl.patchParameteri(GL_PATCH_VERTICES, m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_position", numPosCompsPerVertex, numVertices, 0, &gridPosComps[0]),
			glu::va::Float("in_v_tessParam", 1, numVertices, 0, &gridTessParams[0])
		};

		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches((int)gridIndices.size(), &gridIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface rendered = getPixels(renderCtx, viewport);

		log << TestLog::Image("RenderedImage", "Rendered Image", rendered)
			<< TestLog::Message << "Note: coloring is done to clarify the positioning and orientation of the "
								<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "triangles" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "quads" : DE_NULL)
								<< "; the color of a vertex corresponds to the index of that vertex in the patch"
								<< TestLog::EndMessage;

		if (m_caseType == CASETYPE_BASIC)
			log << TestLog::Message << "Note: each shared vertex has the same index among the primitives it belongs to" << TestLog::EndMessage;
		else if (m_caseType == CASETYPE_PRECISE)
			log << TestLog::Message << "Note: the 'precise' qualifier is used to avoid cracks between primitives" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		// Ad-hoc result verification - check that a certain rectangle in the image contains no black pixels.

		const int startX	= (int)(0.15f * (float)rendered.getWidth());
		const int endX		= (int)(0.85f * (float)rendered.getWidth());
		const int startY	= (int)(0.15f * (float)rendered.getHeight());
		const int endY		= (int)(0.85f * (float)rendered.getHeight());

		for (int y = startY; y < endY; y++)
		for (int x = startX; x < endX; x++)
		{
			const tcu::RGBA pixel = rendered.getPixel(x, y);

			if (pixel.getRed() == 0 && pixel.getGreen() == 0 && pixel.getBlue() == 0)
			{
				log << TestLog::Message << "Failure: there seem to be cracks in the rendered result" << TestLog::EndMessage
					<< TestLog::Message << "Note: pixel with zero r, g and b channels found at " << tcu::IVec2(x, y) << TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				return STOP;
			}
		}

		log << TestLog::Message << "Success: there seem to be no cracks in the rendered result" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}